

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_interpreter_analyzeAndEvaluateStringWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourceCodeText,
          sysbvm_tuple_t sourceCodeDirectory,sysbvm_tuple_t sourceCodeName,
          sysbvm_tuple_t sourceCodeLanguage)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_70 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_24_3_2a7a8b23 gcFrame;
  sysbvm_tuple_t sourceCodeLanguage_local;
  sysbvm_tuple_t sourceCodeName_local;
  sysbvm_tuple_t sourceCodeDirectory_local;
  sysbvm_tuple_t sourceCodeText_local;
  sysbvm_tuple_t environment_local;
  sysbvm_context_t *context_local;
  
  gcFrameRecord.roots = (sysbvm_tuple_t *)environment;
  memset(local_70,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_70);
  sVar1 = sysbvm_sourceCode_create
                    (context,sourceCodeText,sourceCodeDirectory,sourceCodeName,sourceCodeLanguage);
  sVar1 = sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment
                    (context,(sysbvm_tuple_t)gcFrameRecord.roots,sVar1);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_70);
  return sVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_analyzeAndEvaluateStringWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourceCodeText, sysbvm_tuple_t sourceCodeDirectory, sysbvm_tuple_t sourceCodeName, sysbvm_tuple_t sourceCodeLanguage)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.astNode = sysbvm_sourceCode_create(context, sourceCodeText, sourceCodeDirectory, sourceCodeName, sourceCodeLanguage);
    gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment(context, gcFrame.environment, gcFrame.astNode);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}